

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_endStream(ZSTD_CStream *zcs,ZSTD_outBuffer *output)

{
  uint uVar1;
  int iVar2;
  int local_64;
  size_t toFlush;
  size_t checksumSize;
  size_t lastBlockSize;
  size_t err_code;
  size_t remainingToFlush;
  ZSTD_inBuffer input;
  ZSTD_outBuffer *output_local;
  ZSTD_CStream *zcs_local;
  
  input.pos = (size_t)output;
  memset(&remainingToFlush,0,0x18);
  zcs_local = (ZSTD_CStream *)
              ZSTD_compressStream2
                        (zcs,(ZSTD_outBuffer *)input.pos,(ZSTD_inBuffer *)&remainingToFlush,
                         ZSTD_e_end);
  uVar1 = ERR_isError((size_t)zcs_local);
  if ((uVar1 == 0) && ((zcs->appliedParams).nbWorkers < 1)) {
    iVar2 = 3;
    if (zcs->frameEnded != 0) {
      iVar2 = 0;
    }
    if (zcs->frameEnded == 0) {
      local_64 = (zcs->appliedParams).fParams.checksumFlag << 2;
    }
    else {
      local_64 = 0;
    }
    zcs_local = (ZSTD_CStream *)((long)&zcs_local->stage + (long)local_64 + (long)iVar2);
  }
  return (size_t)zcs_local;
}

Assistant:

size_t ZSTD_endStream(ZSTD_CStream* zcs, ZSTD_outBuffer* output)
{
    ZSTD_inBuffer input = { NULL, 0, 0 };
    size_t const remainingToFlush = ZSTD_compressStream2(zcs, output, &input, ZSTD_e_end);
    FORWARD_IF_ERROR( remainingToFlush , "ZSTD_compressStream2 failed");
    if (zcs->appliedParams.nbWorkers > 0) return remainingToFlush;   /* minimal estimation */
    /* single thread mode : attempt to calculate remaining to flush more precisely */
    {   size_t const lastBlockSize = zcs->frameEnded ? 0 : ZSTD_BLOCKHEADERSIZE;
        size_t const checksumSize = (size_t)(zcs->frameEnded ? 0 : zcs->appliedParams.fParams.checksumFlag * 4);
        size_t const toFlush = remainingToFlush + lastBlockSize + checksumSize;
        DEBUGLOG(4, "ZSTD_endStream : remaining to flush : %u", (unsigned)toFlush);
        return toFlush;
    }
}